

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_alloc.c
# Opt level: O0

void * direct_alloc(mstate m,size_t nb)

{
  ulong size;
  void *pvVar1;
  long lVar2;
  ulong *puVar3;
  ulong local_50;
  mchunkptr p;
  size_t psize;
  size_t offset;
  char *mm;
  size_t mmsize;
  size_t nb_local;
  mstate m_local;
  
  size = nb + 0x1036 & 0xfffffffffffff000;
  if ((nb < size) && (pvVar1 = mmap_probe(m->prng,size), pvVar1 != (void *)0xffffffffffffffff)) {
    if (((long)pvVar1 + 0x10U & 7) == 0) {
      local_50 = 0;
    }
    else {
      local_50 = 8 - ((long)pvVar1 + 0x10U & 7) & 7;
    }
    lVar2 = size - local_50;
    puVar3 = (ulong *)((long)pvVar1 + local_50);
    *puVar3 = local_50 | 1;
    puVar3[1] = lVar2 - 0x20U | 2;
    *(undefined8 *)((long)puVar3 + lVar2 + -0x18) = 0xb;
    *(undefined8 *)((long)puVar3 + lVar2 + -0x10) = 0;
    m_local = (mstate)(puVar3 + 2);
  }
  else {
    m_local = (mstate)0x0;
  }
  return m_local;
}

Assistant:

static void *direct_alloc(mstate m, size_t nb)
{
  size_t mmsize = mmap_align(nb + SIX_SIZE_T_SIZES + CHUNK_ALIGN_MASK);
  if (LJ_LIKELY(mmsize > nb)) {     /* Check for wrap around 0 */
    char *mm = (char *)(DIRECT_MMAP(m->prng, mmsize));
    if (mm != CMFAIL) {
      size_t offset = align_offset(chunk2mem(mm));
      size_t psize = mmsize - offset - DIRECT_FOOT_PAD;
      mchunkptr p = (mchunkptr)(mm + offset);
      p->prev_foot = offset | IS_DIRECT_BIT;
      p->head = psize|CINUSE_BIT;
      chunk_plus_offset(p, psize)->head = FENCEPOST_HEAD;
      chunk_plus_offset(p, psize+SIZE_T_SIZE)->head = 0;
      return chunk2mem(p);
    }
  }
  UNUSED(m);
  return NULL;
}